

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t match_char(scanner_t *scanner,char c,int case_sensitive)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  parse_status_t pVar4;
  __int32_t **pp_Var5;
  bool bVar6;
  
  uVar2 = scanner->cursor;
  if (uVar2 < scanner->msg->length) {
    pcVar3 = scanner->msg->buf;
    scanner->cursor = uVar2 + 1;
    cVar1 = pcVar3[uVar2];
    if (case_sensitive == 0) {
      pp_Var5 = __ctype_tolower_loc();
      bVar6 = (*pp_Var5)[c] == (*pp_Var5)[cVar1];
    }
    else {
      bVar6 = cVar1 == c;
    }
    pVar4 = bVar6 ^ PARSE_NO_MATCH;
  }
  else {
    pVar4 = PARSE_INCOMPLETE;
  }
  return pVar4;
}

Assistant:

static UPNP_INLINE parse_status_t match_char(
	scanner_t *scanner, char c, int case_sensitive)
{
	char scan_char;

	if (scanner->cursor >= scanner->msg->length) {
		return PARSE_INCOMPLETE;
	}
	/* read next char from scanner */
	scan_char = scanner->msg->buf[scanner->cursor++];

	if (case_sensitive) {
		return c == scan_char ? PARSE_OK : PARSE_NO_MATCH;
	} else {
		return tolower(c) == tolower(scan_char) ? PARSE_OK
							: PARSE_NO_MATCH;
	}
}